

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sm3tt_arm(void *vd,void *vn,void *vm,uint32_t imm2,uint32_t opcode)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined4 uVar3;
  undefined4 x;
  undefined4 uVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t local_74;
  undefined8 uStack_70;
  uint32_t t;
  CRYPTO_STATE m;
  CRYPTO_STATE n;
  CRYPTO_STATE d;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  uint32_t opcode_local;
  uint32_t imm2_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *(uint64_t *)((long)vd + 8);
  m.l[1] = *vn;
  n.l[0] = *(uint64_t *)((long)vn + 8);
  uStack_70 = *vm;
  m.l[0] = *(uint64_t *)((long)vm + 8);
  n.l[1] = uVar1;
  d.l[0] = uVar2;
  d.l[1] = (uint64_t)vm;
  rm = (uint64_t *)vn;
  rn = (uint64_t *)vd;
  rd._0_4_ = opcode;
  rd._4_4_ = imm2;
  _opcode_local = vm;
  vm_local = vn;
  vn_local = vd;
  if (3 < imm2) {
    __assert_fail("imm2 < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                  ,0x237,"void helper_crypto_sm3tt_arm(void *, void *, void *, uint32_t, uint32_t)")
    ;
  }
  d.words[0] = (uint32_t)uVar2;
  d.words[1] = (uint32_t)(uVar2 >> 0x20);
  x = d.words[1];
  n.words[3] = (uint32_t)(uVar1 >> 0x20);
  uVar3 = n.words[3];
  if ((opcode == 0) || (opcode == 2)) {
    uVar4 = d.words[0];
    local_74 = par(x,uVar4,uVar3);
  }
  else if (opcode == 1) {
    uVar4 = d.words[0];
    local_74 = maj(x,uVar4,uVar3);
  }
  else {
    if (opcode != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                 ,0x243,(char *)0x0);
    }
    uVar4 = d.words[0];
    local_74 = cho(x,uVar4,uVar3);
  }
  iVar5 = n.words[2] + *(int *)((long)&stack0xffffffffffffff90 + (ulong)rd._4_4_ * 4) + local_74;
  n.words[2] = n._12_4_;
  uVar3 = n.words[1];
  if ((uint32_t)rd < 2) {
    uVar6 = ror32(d.words[1],0x14);
    local_74 = (uVar3 ^ uVar6) + iVar5;
    uVar6 = ror32(d.words[0],0x17);
    n.words[3] = uVar6;
  }
  else {
    local_74 = n.words[1] + iVar5;
    uVar6 = rol32(local_74,9);
    uVar7 = rol32(local_74,0x11);
    local_74 = uVar6 ^ uVar7 ^ local_74;
    uVar6 = ror32(d.words[0],0xd);
    n.words[3] = uVar6;
  }
  d.words[0] = d.words[1];
  d.words[1] = local_74;
  *rn = n.l[1];
  rn[1] = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sm3tt)(void *vd, void *vn, void *vm, uint32_t imm2,
                          uint32_t opcode)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    uint32_t t = 0;

    assert(imm2 < 4);

    if (opcode == 0 || opcode == 2) {
        /* SM3TT1A, SM3TT2A */
        t = par(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else if (opcode == 1) {
        /* SM3TT1B */
        t = maj(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else if (opcode == 3) {
        /* SM3TT2B */
        t = cho(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else {
        g_assert_not_reached();
    }

    t += CR_ST_WORD(d, 0) + CR_ST_WORD(m, imm2);

    CR_ST_WORD(d, 0) = CR_ST_WORD(d, 1);

    if (opcode < 2) {
        /* SM3TT1A, SM3TT1B */
        t += CR_ST_WORD(n, 3) ^ ror32(CR_ST_WORD(d, 3), 20);

        CR_ST_WORD(d, 1) = ror32(CR_ST_WORD(d, 2), 23);
    } else {
        /* SM3TT2A, SM3TT2B */
        t += CR_ST_WORD(n, 3);
        t ^= rol32(t, 9) ^ rol32(t, 17);

        CR_ST_WORD(d, 1) = ror32(CR_ST_WORD(d, 2), 13);
    }

    CR_ST_WORD(d, 2) = CR_ST_WORD(d, 3);
    CR_ST_WORD(d, 3) = t;

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}